

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

bool __thiscall
DisasmReplayer::enqueue_create_graphics_pipeline
          (DisasmReplayer *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  PFN_vkCreateGraphicsPipelines p_Var1;
  bool bVar2;
  VkResult VVar3;
  VkPipeline_T *pVVar4;
  VkDevice pVVar5;
  VkPipeline *pipeline_local;
  VkGraphicsPipelineCreateInfo *create_info_local;
  Hash hash_local;
  DisasmReplayer *this_local;
  
  pipeline_local = (VkPipeline *)create_info;
  create_info_local = (VkGraphicsPipelineCreateInfo *)hash;
  hash_local = (Hash)this;
  bVar2 = graphics_pipeline_is_active(this,hash);
  if (bVar2) {
    if (this->device == (VulkanDevice *)0x0) {
      pVVar4 = fake_handle<VkPipeline_T*>((uint64_t)create_info_local);
      *pipeline = pVVar4;
    }
    else {
      bVar2 = Fossilize::VulkanDevice::has_pipeline_stats(this->device);
      if (bVar2) {
        *(uint *)(pipeline_local + 2) = *(uint *)(pipeline_local + 2) | 0xc0;
      }
      fprintf(_stderr,"Fossilize INFO: Creating graphics pipeline %0lX\n",create_info_local);
      fflush(_stderr);
      p_Var1 = vkCreateGraphicsPipelines;
      pVVar5 = Fossilize::VulkanDevice::get_device(this->device);
      VVar3 = (*p_Var1)(pVVar5,this->pipeline_cache,1,(VkGraphicsPipelineCreateInfo *)pipeline_local
                        ,(VkAllocationCallbacks *)0x0,pipeline);
      if (VVar3 != VK_SUCCESS) {
        fprintf(_stderr,"Fossilize ERROR:  ... Failed!\n");
        fflush(_stderr);
        return false;
      }
      fprintf(_stderr,"Fossilize INFO:  ... Succeeded!\n");
      fflush(_stderr);
    }
    std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::push_back
              (&this->graphics_pipelines,pipeline);
    std::
    vector<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
    ::push_back(&this->graphics_infos,(value_type *)&pipeline_local);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->graphics_hashes,(value_type *)&create_info_local);
  }
  else {
    pVVar4 = fake_handle<VkPipeline_T*>((uint64_t)create_info_local);
    *pipeline = pVVar4;
  }
  return true;
}

Assistant:

bool enqueue_create_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		if (!graphics_pipeline_is_active(hash))
		{
			*pipeline = fake_handle<VkPipeline>(hash);
			return true;
		}

		if (device)
		{
			if (device->has_pipeline_stats())
				const_cast<VkGraphicsPipelineCreateInfo *>(create_info)->flags |=
						VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR | VK_PIPELINE_CREATE_CAPTURE_INTERNAL_REPRESENTATIONS_BIT_KHR;

			LOGI("Creating graphics pipeline %0" PRIX64 "\n", hash);
			if (vkCreateGraphicsPipelines(device->get_device(), pipeline_cache, 1, create_info, nullptr, pipeline) !=
			    VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*pipeline = fake_handle<VkPipeline>(hash);

		graphics_pipelines.push_back(*pipeline);
		graphics_infos.push_back(create_info);
		graphics_hashes.push_back(hash);
		return true;
	}